

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

uchar duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_int,unsigned_char>
                (uint input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  byte bVar1;
  string sStack_48;
  
  if (0xff < input) {
    CastExceptionText<unsigned_int,unsigned_char>(&sStack_48,(duckdb *)(ulong)input,(uint)idx);
    bVar1 = HandleVectorCastError::Operation<unsigned_char>
                      (&sStack_48,mask,idx,(VectorTryCastData *)dataptr);
    input = (uint)bVar1;
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  return (uchar)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}